

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TheoryAxioms.cpp
# Opt level: O0

void __thiscall Shell::TheoryAxioms::addDiscriminationAxiom(TheoryAxioms *this,TermAlgebra *ta)

{
  initializer_list<Kernel::Literal_*> lits;
  undefined1 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint predicate;
  TermList *pTVar6;
  TermAlgebraConstructor *this_00;
  size_t sVar7;
  TermAlgebra *in_RSI;
  TermList *in_RDI;
  Literal *lit;
  uint c_1;
  TermAlgebraConstructor *constructor;
  uint i_2;
  TermList term;
  uint var;
  TermStack variables;
  TermAlgebraConstructor *c;
  uint i_1;
  Array<Kernel::TermList> cases;
  uint i;
  uint v;
  TermStack args;
  TermList in_stack_fffffffffffffe48;
  TermList in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  Stack<Kernel::TermList> *in_stack_fffffffffffffe60;
  Stack<Kernel::TermList> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined7 in_stack_fffffffffffffe90;
  uint arity;
  TermAlgebraConstructor *in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffee8;
  uint uVar8;
  undefined8 in_stack_ffffffffffffff08;
  uint local_c4;
  uint local_b4;
  uint64_t local_b0;
  uint local_9c;
  Stack<Kernel::TermList> local_98;
  TermAlgebraConstructor *local_78;
  uint local_6c;
  Array<Kernel::TermList> local_68 [2];
  uint local_38;
  int local_34;
  Stack<Kernel::TermList> local_30;
  TermAlgebra *local_10;
  
  local_10 = in_RSI;
  TermAlgebra::nTypeArgs((TermAlgebra *)0xd18e64);
  Lib::Stack<Kernel::TermList>::Stack
            (in_stack_fffffffffffffe60,CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)
            );
  local_34 = 0;
  local_38 = 0;
  while (uVar8 = local_38, uVar2 = TermAlgebra::nTypeArgs((TermAlgebra *)0xd18ea6), uVar8 < uVar2) {
    local_34 = local_34 + 1;
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffe50._content,
               (uint)(in_stack_fffffffffffffe48._content >> 0x20),
               SUB81(in_stack_fffffffffffffe48._content >> 0x18,0));
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)in_stack_fffffffffffffe48._content,
               in_stack_fffffffffffffe50);
    local_38 = local_38 + 1;
  }
  uVar3 = TermAlgebra::nConstructors(local_10);
  Lib::Array<Kernel::TermList>::Array
            ((Array<Kernel::TermList> *)in_stack_fffffffffffffe60,
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  local_6c = 0;
  while (uVar5 = local_6c, uVar4 = TermAlgebra::nConstructors(local_10), uVar5 < uVar4) {
    local_78 = TermAlgebra::constructor
                         ((TermAlgebra *)in_stack_fffffffffffffe50._content,
                          (uint)(in_stack_fffffffffffffe48._content >> 0x20));
    Lib::Stack<Kernel::TermList>::Stack
              ((Stack<Kernel::TermList> *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68);
    for (local_9c = TermAlgebraConstructor::numTypeArguments((TermAlgebraConstructor *)0xd18ff3);
        uVar5 = TermAlgebraConstructor::arity((TermAlgebraConstructor *)0xd19025), local_9c < uVar5;
        local_9c = local_9c + 1) {
      Kernel::TermList::TermList
                ((TermList *)in_stack_fffffffffffffe50._content,
                 (uint)(in_stack_fffffffffffffe48._content >> 0x20),
                 SUB81(in_stack_fffffffffffffe48._content >> 0x18,0));
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)in_stack_fffffffffffffe48._content,
                 in_stack_fffffffffffffe50);
    }
    TermAlgebraConstructor::functor(local_78);
    in_stack_fffffffffffffec8 =
         (TermAlgebraConstructor *)Lib::Stack<Kernel::TermList>::size(&local_98);
    Lib::Stack<Kernel::TermList>::begin(&local_98);
    Kernel::Term::create
              ((uint)((ulong)in_stack_ffffffffffffff08 >> 0x20),(uint)in_stack_ffffffffffffff08,
               in_RDI);
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffe50._content,
               (Term *)in_stack_fffffffffffffe48._content);
    pTVar6 = Lib::Array<Kernel::TermList>::operator[]
                       ((Array<Kernel::TermList> *)in_stack_fffffffffffffe50._content,
                        in_stack_fffffffffffffe48._content);
    pTVar6->_content = local_b0;
    Lib::Stack<Kernel::TermList>::~Stack
              ((Stack<Kernel::TermList> *)in_stack_fffffffffffffe50._content);
    local_6c = local_6c + 1;
  }
  local_b4 = 0;
  while (arity = local_b4, predicate = TermAlgebra::nConstructors(local_10), arity < predicate) {
    this_00 = TermAlgebra::constructor
                        ((TermAlgebra *)in_stack_fffffffffffffe50._content,
                         (uint)(in_stack_fffffffffffffe48._content >> 0x20));
    uVar1 = TermAlgebraConstructor::hasDiscriminator(this_00);
    if ((bool)uVar1) {
      for (local_c4 = 0; sVar7 = Lib::Array<Kernel::TermList>::size(local_68), local_c4 < sVar7;
          local_c4 = local_c4 + 1) {
        Lib::Array<Kernel::TermList>::operator[]
                  ((Array<Kernel::TermList> *)in_stack_fffffffffffffe50._content,
                   in_stack_fffffffffffffe48._content);
        Lib::Stack<Kernel::TermList>::push
                  ((Stack<Kernel::TermList> *)in_stack_fffffffffffffe48._content,
                   in_stack_fffffffffffffe50);
        TermAlgebraConstructor::discriminator(in_stack_fffffffffffffec8);
        Lib::Stack<Kernel::TermList>::size(&local_30);
        Lib::Stack<Kernel::TermList>::begin(&local_30);
        in_stack_fffffffffffffe50._content =
             (uint64_t)
             Kernel::Literal::create
                       (predicate,arity,SUB81((ulong)this_00 >> 0x38,0),
                        (TermList *)CONCAT17(uVar1,in_stack_fffffffffffffe90));
        in_stack_fffffffffffffe48 = Lib::Stack<Kernel::TermList>::pop(&local_30);
        lits._M_array._4_4_ = uVar2;
        lits._M_array._0_4_ = uVar8;
        lits._M_len = (size_type)in_RDI;
        addTheoryClauseFromLits
                  ((TheoryAxioms *)CONCAT44(uVar3,uVar4),lits,(InferenceRule)(uVar5 >> 0x18),
                   in_stack_fffffffffffffee8);
      }
    }
    local_b4 = local_b4 + 1;
  }
  Lib::Array<Kernel::TermList>::~Array
            ((Array<Kernel::TermList> *)in_stack_fffffffffffffe50._content);
  Lib::Stack<Kernel::TermList>::~Stack
            ((Stack<Kernel::TermList> *)in_stack_fffffffffffffe50._content);
  return;
}

Assistant:

void TheoryAxioms::addDiscriminationAxiom(TermAlgebra* ta) {
  TermStack args(ta->nTypeArgs());
  unsigned v = 0;
  for (unsigned i = 0; i < ta->nTypeArgs(); i++) {
    args.push(TermList(v++,false));
  }
  Array<TermList> cases(ta->nConstructors());
  for (unsigned i = 0; i < ta->nConstructors(); i++) {
    TermAlgebraConstructor* c = ta->constructor(i);

    TermStack variables = args;
    for (unsigned var = c->numTypeArguments(); var < c->arity(); var++) {
      variables.push(TermList(var, false));
    }

    TermList term(Term::create(c->functor(), (unsigned)variables.size(), variables.begin()));
    cases[i] = term;
  }

  for (unsigned i = 0; i < ta->nConstructors(); i++) {
    TermAlgebraConstructor* constructor = ta->constructor(i);

    if (!constructor->hasDiscriminator()) continue;

    for (unsigned c = 0; c < cases.size(); c++) {
      args.push(cases[c]);
      Literal* lit = Literal::create(constructor->discriminator(), args.size(), c == i, args.begin());
      args.pop();
      addTheoryClauseFromLits({lit}, InferenceRule::TERM_ALGEBRA_DISCRIMINATION_AXIOM,CHEAP);
    }
  }
}